

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void build_obmc_inter_pred_above
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *above_mi,void *fun_ctxt,int num_planes)

{
  BLOCK_SIZE BVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int length;
  int iVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  byte in_CL;
  long lVar9;
  int in_EDX;
  MACROBLOCKD *in_RDI;
  long *in_stack_00000008;
  int in_stack_00000010;
  int is_hbd;
  uint8_t *mask;
  uint8_t *tmp;
  int tmp_stride;
  uint8_t *dst;
  int dst_stride;
  int plane_col;
  int bh;
  int bw;
  macroblockd_plane *pd;
  int plane;
  int overlap;
  BLOCK_SIZE bsize;
  obmc_inter_pred_ctxt *ctxt;
  macroblockd_plane *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  uint local_88;
  int local_44;
  
  BVar1 = (*in_RDI->mi)->bsize;
  if (block_size_high[BVar1] < 0x40) {
    local_88 = (uint)block_size_high[BVar1];
  }
  else {
    local_88 = 0x40;
  }
  for (local_44 = 0; local_44 < in_stack_00000010; local_44 = local_44 + 1) {
    lVar9 = (long)local_44;
    iVar4 = (int)((uint)in_CL << 2) >> ((byte)in_RDI->plane[lVar9].subsampling_x & 0x1f);
    length = ((int)local_88 >> 1) >> ((byte)in_RDI->plane[lVar9].subsampling_y & 0x1f);
    iVar5 = (in_EDX << 2) >> ((byte)in_RDI->plane[lVar9].subsampling_x & 0x1f);
    iVar6 = av1_skip_u4x4_pred_in_obmc
                      ((BLOCK_SIZE)((uint)in_stack_ffffffffffffff60 >> 0x18),
                       in_stack_ffffffffffffff58,0);
    if (iVar6 == 0) {
      uVar2 = in_RDI->plane[lVar9].dst.stride;
      puVar7 = in_RDI->plane[lVar9].dst.buf + iVar5;
      uVar3 = *(uint32_t *)(in_stack_00000008[1] + (long)local_44 * 4);
      puVar8 = (uint8_t *)(*(long *)(*in_stack_00000008 + (long)local_44 * 8) + (long)iVar5);
      in_stack_ffffffffffffff58 = (macroblockd_plane *)av1_get_obmc_mask(length);
      iVar5 = is_cur_buf_hbd(in_RDI);
      if (iVar5 == 0) {
        (*aom_blend_a64_vmask)
                  (puVar7,uVar2,puVar7,uVar2,puVar8,uVar3,(uint8_t *)in_stack_ffffffffffffff58,iVar4
                   ,length);
        in_stack_ffffffffffffff60 = iVar4;
      }
      else {
        (*aom_highbd_blend_a64_vmask)
                  (puVar7,uVar2,puVar7,uVar2,puVar8,uVar3,(uint8_t *)in_stack_ffffffffffffff58,iVar4
                   ,length,in_RDI->bd);
        in_stack_ffffffffffffff60 = iVar4;
      }
    }
  }
  return;
}

Assistant:

static inline void build_obmc_inter_pred_above(
    MACROBLOCKD *xd, int rel_mi_row, int rel_mi_col, uint8_t op_mi_size,
    int dir, MB_MODE_INFO *above_mi, void *fun_ctxt, const int num_planes) {
  (void)above_mi;
  (void)rel_mi_row;
  (void)dir;
  struct obmc_inter_pred_ctxt *ctxt = (struct obmc_inter_pred_ctxt *)fun_ctxt;
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;
  const int overlap =
      AOMMIN(block_size_high[bsize], block_size_high[BLOCK_64X64]) >> 1;

  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    const int bw = (op_mi_size * MI_SIZE) >> pd->subsampling_x;
    const int bh = overlap >> pd->subsampling_y;
    const int plane_col = (rel_mi_col * MI_SIZE) >> pd->subsampling_x;

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, 0)) continue;

    const int dst_stride = pd->dst.stride;
    uint8_t *const dst = &pd->dst.buf[plane_col];
    const int tmp_stride = ctxt->adjacent_stride[plane];
    const uint8_t *const tmp = &ctxt->adjacent[plane][plane_col];
    const uint8_t *const mask = av1_get_obmc_mask(bh);
#if CONFIG_AV1_HIGHBITDEPTH
    const int is_hbd = is_cur_buf_hbd(xd);
    if (is_hbd)
      aom_highbd_blend_a64_vmask(dst, dst_stride, dst, dst_stride, tmp,
                                 tmp_stride, mask, bw, bh, xd->bd);
    else
      aom_blend_a64_vmask(dst, dst_stride, dst, dst_stride, tmp, tmp_stride,
                          mask, bw, bh);
#else
    aom_blend_a64_vmask(dst, dst_stride, dst, dst_stride, tmp, tmp_stride, mask,
                        bw, bh);
#endif
  }
}